

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O1

void addstr2buff(BuffFS *buff,char *str,size_t slen)

{
  size_t sVar1;
  char *pcVar2;
  size_t osize;
  
  if (buff->err != 0) {
    return;
  }
  osize = buff->buffsize;
  sVar1 = buff->blen;
  if (osize - sVar1 < slen) {
    if (0x3fffffffffffffff - sVar1 < slen) {
      memcpy(buff->b + sVar1,str,osize - sVar1);
      buff->blen = buff->buffsize;
      buff->err = 2;
      return;
    }
    sVar1 = osize + slen;
    pcVar2 = buff->b;
    if (pcVar2 == buff->space) {
      pcVar2 = (char *)0x0;
      osize = 0;
    }
    pcVar2 = (char *)luaM_realloc_(buff->L,pcVar2,osize,sVar1);
    if (pcVar2 == (char *)0x0) {
      buff->err = 1;
    }
    else {
      if (buff->b == buff->space) {
        memcpy(pcVar2,buff->b,buff->blen);
      }
      buff->b = pcVar2;
      buff->buffsize = sVar1;
    }
    if (pcVar2 == (char *)0x0) {
      return;
    }
  }
  memcpy(buff->b + buff->blen,str,slen);
  buff->blen = buff->blen + slen;
  return;
}

Assistant:

static void addstr2buff (BuffFS *buff, const char *str, size_t slen) {
  size_t left = buff->buffsize - buff->blen;  /* space left in the buffer */
  if (buff->err)  /* do nothing else after an error */
    return;
  if (slen > left) {  /* new string doesn't fit into current buffer? */
    if (slen > ((MAX_SIZE/2) - buff->blen)) {  /* overflow? */
      memcpy(buff->b + buff->blen, str, left);  /* copy what it can */
      buff->blen = buff->buffsize;
      buff->err = 2;  /* doesn't add anything else */
      return;
    }
    else {
      size_t newsize = buff->buffsize + slen;  /* limited to MAX_SIZE/2 */
      char *newb =
        (buff->b == buff->space)  /* still using static space? */
        ? luaM_reallocvector(buff->L, NULL, 0, newsize, char)
        : luaM_reallocvector(buff->L, buff->b, buff->buffsize, newsize,
                                                               char);
      if (newb == NULL) {  /* allocation error? */
        buff->err = 1;  /* signal a memory error */
        return;
      }
      if (buff->b == buff->space)  /* new buffer (not reallocated)? */
        memcpy(newb, buff->b, buff->blen);  /* copy previous content */
      buff->b = newb;  /* set new (larger) buffer... */
      buff->buffsize = newsize;  /* ...and its new size */
    }
  }
  memcpy(buff->b + buff->blen, str, slen);  /* copy new content */
  buff->blen += slen;
}